

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.h
# Opt level: O1

void __thiscall GLPortal::GLPortal(GLPortal *this,bool local)

{
  undefined7 in_register_00000031;
  
  this->_vptr_GLPortal = (_func_int **)&PTR__GLPortal_008420c0;
  (this->savedmapsection).Array = (uchar *)0x0;
  (this->savedmapsection).Most = 0;
  (this->savedmapsection).Count = 0;
  (this->mPrimIndices).Array = (uint *)0x0;
  (this->mPrimIndices).Most = 0;
  (this->mPrimIndices).Count = 0;
  (this->lines).Array = (GLWall *)0x0;
  (this->lines).Most = 0;
  (this->lines).Count = 0;
  if ((int)CONCAT71(in_register_00000031,local) == 0) {
    TArray<GLPortal_*,_GLPortal_*>::Grow(&portals,1);
    portals.Array[portals.Count] = this;
    portals.Count = portals.Count + 1;
  }
  return;
}

Assistant:

GLPortal(bool local = false) { if (!local) portals.Push(this); }